

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::InfoParser::ProcessLine(InfoParser *this)

{
  string *s;
  bool bVar1;
  string sStack_38;
  
  s = &(this->super_LineParser).Line;
  bVar1 = cmsys::RegularExpression::find(&this->RegexCheckOut,s);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexCheckOut,1);
    std::__cxx11::string::operator=((string *)&this->BZR->URL,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    this->CheckOutFound = true;
  }
  else if (this->CheckOutFound == false) {
    bVar1 = cmsys::RegularExpression::find(&this->RegexParent,s);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexParent,1);
      std::__cxx11::string::operator=((string *)&this->BZR->URL,(string *)&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->RegexCheckOut.find(this->Line)) {
      this->BZR->URL = this->RegexCheckOut.match(1);
      CheckOutFound = true;
    } else if (!CheckOutFound && this->RegexParent.find(this->Line)) {
      this->BZR->URL = this->RegexParent.match(1);
    }
    return true;
  }